

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * tinyusdz::print_typed_attr<tinyusdz::value::AssetPath>
                   (string *__return_storage_ptr__,
                   TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *attr,
                   string *name,uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  pointer pPVar4;
  Path *v;
  string *psVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ostream *poVar10;
  long lVar11;
  uint32_t indent_00;
  undefined4 in_register_0000000c;
  pprint *this;
  pointer pPVar12;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_01;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  AssetPath a;
  stringstream ss;
  AssetPath local_298;
  string *local_258;
  string *local_250;
  byte local_248;
  Animatable<tinyusdz::value::AssetPath> local_240;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  this = (pprint *)CONCAT44(in_register_0000000c,indent);
  local_250 = name;
  std::__cxx11::stringstream::stringstream(local_1b8);
  bVar9 = (attr->_attrib).has_value_;
  if ((((bVar9 != false) ||
       ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start)) || (attr->_value_empty != false)) ||
     (attr->_blocked == true)) {
    pPVar4 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pPVar12 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((pPVar12 == pPVar4 && bVar9 == false) && (attr->_blocked == false)) {
      cVar3 = attr->_value_empty;
    }
    else {
      cVar3 = '\0';
    }
    bVar13 = pPVar12 != pPVar4;
    local_258 = __return_storage_ptr__;
    local_248 = bVar9;
    if ((bVar9 ^ 1U) == 0) {
      nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::
      construct_value((storage_t<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)&local_240,
                      (value_type *)&(attr->_attrib).contained);
    }
    bVar7 = local_240._has_value;
    bVar6 = local_248;
    indent_00 = (uint32_t)pPVar12;
    if (local_248 == 1) {
      if (local_240._ts._dirty == true) {
        TypedTimeSamples<tinyusdz::value::AssetPath>::update(&local_240._ts);
      }
      bVar14 = local_240._ts._samples.
               super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
               local_240._ts._samples.
               super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      bVar14 = false;
    }
    if (((local_248 == 1) && (local_240._blocked == false)) && (local_240._has_value == false)) {
      bVar15 = local_240._ts._samples.
               super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_240._ts._samples.
               super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::AssetPath>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      bVar15 = false;
    }
    bVar8 = AttrMetas::authored(&attr->_metas);
    psVar5 = local_250;
    if (((bVar8) || ((byte)(bVar13 & (bVar9 ^ 1U) | bVar15) != 1)) ||
       (n_01 = n, (cVar3 != '\0' || attr->_blocked != false) || (bVar6 & bVar7) != 0)) {
      pprint::Indent_abi_cxx11_(&local_298.asset_path_,this,n);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_298.asset_path_._M_dataplus._M_p,
                 local_298.asset_path_._M_string_length);
      paVar1 = &local_298.asset_path_.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.asset_path_._M_dataplus._M_p != paVar1) {
        operator_delete(local_298.asset_path_._M_dataplus._M_p,
                        CONCAT26(local_298.asset_path_.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_298.asset_path_.field_2._M_allocated_capacity._4_2_,
                                          local_298.asset_path_.field_2._M_allocated_capacity._0_4_)
                                ) + 1);
      }
      local_298.asset_path_.field_2._M_allocated_capacity._0_4_ = 0x65737361;
      local_298.asset_path_.field_2._M_allocated_capacity._4_2_ = 0x74;
      local_298.asset_path_._M_string_length = 5;
      local_298.asset_path_._M_dataplus._M_p = (pointer)paVar1;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,5)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.asset_path_._M_dataplus._M_p != paVar1) {
        operator_delete(local_298.asset_path_._M_dataplus._M_p,
                        CONCAT26(local_298.asset_path_.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_298.asset_path_.field_2._M_allocated_capacity._4_2_,
                                          local_298.asset_path_.field_2._M_allocated_capacity._0_4_)
                                ) + 1);
      }
      if (attr->_blocked == true) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = None",7);
      }
      else if ((bVar6 & bVar7) != 0) {
        paVar2 = &local_298.resolved_path_.field_2;
        local_298.asset_path_._M_string_length = 0;
        local_298.asset_path_.field_2._M_allocated_capacity._0_4_ =
             local_298.asset_path_.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
        local_298.resolved_path_._M_string_length = 0;
        local_298.resolved_path_.field_2._M_local_buf[0] = '\0';
        local_298.asset_path_._M_dataplus._M_p = (pointer)paVar1;
        local_298.resolved_path_._M_dataplus._M_p = (pointer)paVar2;
        if (local_248 == 0) goto LAB_0022cd22;
        bVar9 = Animatable<tinyusdz::value::AssetPath>::get_scalar(&local_240,&local_298);
        if (bVar9) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
          std::operator<<(local_1a8,&local_298);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = [InternalError]",0x12);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298.resolved_path_._M_dataplus._M_p != paVar2) {
          operator_delete(local_298.resolved_path_._M_dataplus._M_p,
                          CONCAT71(local_298.resolved_path_.field_2._M_allocated_capacity._1_7_,
                                   local_298.resolved_path_.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298.asset_path_._M_dataplus._M_p != paVar1) {
          operator_delete(local_298.asset_path_._M_dataplus._M_p,
                          CONCAT26(local_298.asset_path_.field_2._M_allocated_capacity._6_2_,
                                   CONCAT24(local_298.asset_path_.field_2._M_allocated_capacity.
                                            _4_2_,local_298.asset_path_.field_2.
                                                  _M_allocated_capacity._0_4_)) + 1);
        }
      }
      bVar9 = AttrMetas::authored(&attr->_metas);
      if (bVar9) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
        print_attr_metas_abi_cxx11_
                  (&local_298.asset_path_,(tinyusdz *)attr,(AttrMeta *)(ulong)(indent + 1),indent_00
                  );
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,local_298.asset_path_._M_dataplus._M_p,
                             local_298.asset_path_._M_string_length);
        pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)indent,n_00);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298.asset_path_._M_dataplus._M_p != paVar1) {
          operator_delete(local_298.asset_path_._M_dataplus._M_p,
                          CONCAT26(local_298.asset_path_.field_2._M_allocated_capacity._6_2_,
                                   CONCAT24(local_298.asset_path_.field_2._M_allocated_capacity.
                                            _4_2_,local_298.asset_path_.field_2.
                                                  _M_allocated_capacity._0_4_)) + 1);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      n_01 = extraout_EDX;
    }
    if (bVar14) {
      pprint::Indent_abi_cxx11_(&local_298.asset_path_,this,n_01);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_298.asset_path_._M_dataplus._M_p,
                 local_298.asset_path_._M_string_length);
      paVar1 = &local_298.asset_path_.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.asset_path_._M_dataplus._M_p != paVar1) {
        operator_delete(local_298.asset_path_._M_dataplus._M_p,
                        CONCAT26(local_298.asset_path_.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_298.asset_path_.field_2._M_allocated_capacity._4_2_,
                                          local_298.asset_path_.field_2._M_allocated_capacity._0_4_)
                                ) + 1);
      }
      local_298.asset_path_.field_2._M_allocated_capacity._0_4_ = 0x65737361;
      local_298.asset_path_.field_2._M_allocated_capacity._4_2_ = 0x74;
      local_298.asset_path_._M_string_length = 5;
      local_298.asset_path_._M_dataplus._M_p = (pointer)paVar1;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,5)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.asset_path_._M_dataplus._M_p != paVar1) {
        operator_delete(local_298.asset_path_._M_dataplus._M_p,
                        CONCAT26(local_298.asset_path_.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_298.asset_path_.field_2._M_allocated_capacity._4_2_,
                                          local_298.asset_path_.field_2._M_allocated_capacity._0_4_)
                                ) + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".timeSamples = ",0xf);
      if (local_248 == 0) {
LAB_0022cd22:
        __assert_fail("has_value()",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                      ,0x584,
                      "const value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::AssetPath>>::value() const [T = tinyusdz::Animatable<tinyusdz::value::AssetPath>]"
                     );
      }
      print_typed_timesamples<tinyusdz::value::AssetPath>
                (&local_298.asset_path_,&local_240._ts,indent);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_298.asset_path_._M_dataplus._M_p,
                 local_298.asset_path_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.asset_path_._M_dataplus._M_p != paVar1) {
        operator_delete(local_298.asset_path_._M_dataplus._M_p,
                        CONCAT26(local_298.asset_path_.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_298.asset_path_.field_2._M_allocated_capacity._4_2_,
                                          local_298.asset_path_.field_2._M_allocated_capacity._0_4_)
                                ) + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      n_01 = extraout_EDX_00;
    }
    if ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pprint::Indent_abi_cxx11_(&local_298.asset_path_,this,n_01);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_298.asset_path_._M_dataplus._M_p,
                 local_298.asset_path_._M_string_length);
      paVar1 = &local_298.asset_path_.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.asset_path_._M_dataplus._M_p != paVar1) {
        operator_delete(local_298.asset_path_._M_dataplus._M_p,
                        CONCAT26(local_298.asset_path_.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_298.asset_path_.field_2._M_allocated_capacity._4_2_,
                                          local_298.asset_path_.field_2._M_allocated_capacity._0_4_)
                                ) + 1);
      }
      local_298.asset_path_.field_2._M_allocated_capacity._0_4_ = 0x65737361;
      local_298.asset_path_.field_2._M_allocated_capacity._4_2_ = 0x74;
      local_298.asset_path_._M_string_length = 5;
      local_298.asset_path_._M_dataplus._M_p = (pointer)paVar1;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,5)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.asset_path_._M_dataplus._M_p != paVar1) {
        operator_delete(local_298.asset_path_._M_dataplus._M_p,
                        CONCAT26(local_298.asset_path_.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_298.asset_path_.field_2._M_allocated_capacity._4_2_,
                                          local_298.asset_path_.field_2._M_allocated_capacity._0_4_)
                                ) + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
      v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
          .super__Vector_impl_data._M_start;
      lVar11 = ((long)(attr->_paths).
                      super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)v >> 4) * 0x4ec4ec4ec4ec4ec5;
      if (lVar11 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
      }
      else if (lVar11 == 1) {
        std::operator<<(local_1a8,v);
      }
      else {
        std::operator<<(local_1a8,&attr->_paths);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    }
    __return_storage_ptr__ = local_258;
    if (local_248 == 1) {
      nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::value::AssetPath>_>::
      destruct_value((storage_t<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)&local_240);
      __return_storage_ptr__ = local_258;
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<Animatable<T>> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    DCOUT("name " << name);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_timesamples " << has_timesamples);
    DCOUT("has_default " << has_default);

    //
    // Emit default value(includes ValueBlock and empty definition) and metada
    //
    // float a METADATA
    // float a = None METADATA
    // float a = 1.5 METADATA
    // 
    // Also emit this line if the attribute contains metadata
    // Do not emit when Attribute is connection only or timesamples only.
    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (has_default) {
        T a;
        if (pv.value().get_scalar(&a)) {
          ss << " = " << a;
        } else {
          ss << " = [InternalError]";
        }
      } else { // is_value_empty
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    // timesamples
    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = "
         << print_typed_timesamples(pv.value().get_timesamples(), indent);
      ss << "\n";
    }

    // connection
    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }

  }

  return ss.str();
}